

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_commands.cpp
# Opt level: O0

Am_Wrapper * Am_Get_Owners_Command_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Wrapper *pAVar2;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40 [3];
  Am_Object local_28;
  Am_Object command;
  Am_Value v;
  Am_Object *self_local;
  
  Am_Value::Am_Value((Am_Value *)&command);
  Am_Object::Am_Object(&local_28);
  Am_Object::Get_Owner(&local_48,(Am_Slot_Flags)self);
  Am_Object::Get_Owner(local_40,(Am_Slot_Flags)&local_48);
  in_value = Am_Object::Peek(local_40,0xc5,0);
  Am_Value::operator=((Am_Value *)&command,in_value);
  Am_Object::~Am_Object(local_40);
  Am_Object::~Am_Object(&local_48);
  bVar1 = Am_Value::Valid((Am_Value *)&command);
  if ((bVar1) && ((short)command.data == -0x5fff)) {
    Am_Object::operator=(&local_28,(Am_Value *)&command);
    Am_Object::Am_Object(&local_50,&Am_Command);
    bVar1 = Am_Object::Is_Instance_Of(&local_28,&local_50);
    Am_Object::~Am_Object(&local_50);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      Am_Object::operator=(&local_28,&Am_No_Object);
    }
  }
  pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(&local_28);
  Am_Object::~Am_Object(&local_28);
  Am_Value::~Am_Value((Am_Value *)&command);
  return pAVar2;
}

Assistant:

Am_Define_Object_Formula(Am_Get_Owners_Command)
{
  //owner is inter, owner of inter is widget, get command from widget
  Am_Value v;
  Am_Object command;
  v = self.Get_Owner().Get_Owner().Peek(Am_COMMAND);
  if (v.Valid() && v.type == Am_OBJECT) {
    command = v;
    if (!command.Is_Instance_Of(Am_Command))
      command = Am_No_Object;
  }
  return command;
}